

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_forcestep(lua_State *L)

{
  global_State *g;
  undefined1 auVar1 [16];
  lu_mem lVar2;
  long lVar3;
  uint uVar4;
  lu_mem lVar5;
  l_mem debt;
  long lVar6;
  ulong uVar7;
  lu_mem estimate;
  long lVar8;
  
  g = L->l_G;
  lVar6 = 0x7ffffffffffffffc;
  if (g->gckind == '\x02') {
    uVar7 = g->GCestimate;
    if (uVar7 == 0) {
      luaC_fullgc(L,0);
      lVar5 = g->GCdebt + g->totalbytes;
      lVar2 = lVar5;
    }
    else {
      luaC_runtilstate(L,0x20);
      g->gcstate = '\0';
      lVar5 = g->GCdebt + g->totalbytes;
      lVar2 = 0;
      if (lVar5 <= (long)g->gcmajorinc * (uVar7 / 100)) {
        lVar2 = uVar7;
      }
    }
    g->GCestimate = lVar2;
    if ((long)g->gcpause <
        SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7ffffffffffffffc)) / SEXT816((long)lVar5 / 100),0)) {
      lVar6 = ((long)lVar5 / 100) * (long)g->gcpause;
    }
  }
  else {
    uVar7 = 0x28;
    if (0x28 < g->gcstepmul) {
      uVar7 = (ulong)(uint)g->gcstepmul;
    }
    lVar3 = g->GCdebt / 200 + 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    lVar8 = lVar3 * uVar7;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7ffffffffffffffc)) / auVar1,0) <= lVar3) {
      lVar8 = 0x7ffffffffffffffc;
    }
    do {
      lVar5 = singlestep(L);
      lVar8 = lVar8 - lVar5;
      if (lVar8 < -0x95f) {
        if (g->gcstate != '\x05') {
          debt = (lVar8 / (long)uVar7) * 200;
          goto LAB_0010a74c;
        }
        break;
      }
    } while (g->gcstate != '\x05');
    lVar3 = (long)g->GCestimate / 100;
    if ((long)g->gcpause <
        SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7ffffffffffffffc)) / SEXT816(lVar3),0)) {
      lVar6 = lVar3 * g->gcpause;
    }
    lVar5 = g->GCdebt + g->totalbytes;
  }
  debt = lVar5 - lVar6;
LAB_0010a74c:
  luaE_setdebt(g,debt);
  if (g->tobefnz != (GCObject *)0x0) {
    uVar4 = 0;
    do {
      if ((3 < uVar4) && (g->gcstate != '\x05')) {
        return;
      }
      GCTM(L,1);
      uVar4 = uVar4 + 1;
    } while (g->tobefnz != (GCObject *)0x0);
  }
  return;
}

Assistant:

void luaC_forcestep (lua_State *L) {
  global_State *g = G(L);
  int i;
  if (isgenerational(g)) generationalcollection(L);
  else incstep(L);
  /* run a few finalizers (or all of them at the end of a collect cycle) */
  for (i = 0; g->tobefnz && (i < GCFINALIZENUM || g->gcstate == GCSpause); i++)
    GCTM(L, 1);  /* call one finalizer */
}